

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legacy.c
# Opt level: O1

objc_protocol * objc_upgrade_protocol_gcc(objc_protocol_gcc *p)

{
  objc_protocol *poVar1;
  objc_protocol_method_description_list *poVar2;
  Protocol *pPVar3;
  
  if ((objc_class *)p->isa == &_OBJC_CLASS_ProtocolGCC) {
    pPVar3 = objc_getProtocol(p->name);
    return pPVar3;
  }
  p->isa = (id)&_OBJC_CLASS_ProtocolGCC;
  poVar1 = (objc_protocol *)class_createInstance(&_OBJC_CLASS_Protocol,0);
  poVar1->name = p->name;
  poVar1->protocol_list = p->protocol_list;
  poVar2 = upgrade_protocol_method_list_gcc(p->instance_methods);
  poVar1->instance_methods = poVar2;
  poVar2 = upgrade_protocol_method_list_gcc(p->class_methods);
  poVar1->class_methods = poVar2;
  if ((Class)poVar1->isa != (Class)0x0) {
    return poVar1;
  }
  __assert_fail("proto->isa",
                "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/legacy.c",
                0x1ac,"struct objc_protocol *objc_upgrade_protocol_gcc(struct objc_protocol_gcc *)")
  ;
}

Assistant:

objc_protocol *objc_upgrade_protocol_gcc(struct objc_protocol_gcc *p)
{
	// If the protocol has already been upgraded, the don't try to upgrade it twice.
	if (p->isa == (id)&_OBJC_CLASS_ProtocolGCC)
	{
		return objc_getProtocol(p->name);
	}
	p->isa = (id)&_OBJC_CLASS_ProtocolGCC;
	Protocol *proto =
		(Protocol*)class_createInstance(&_OBJC_CLASS_Protocol, 0);
	proto->name = p->name;
	// Aliasing of this between the new and old structures means that when this
	// returns these will all be updated.
	proto->protocol_list = p->protocol_list;
	proto->instance_methods = upgrade_protocol_method_list_gcc(p->instance_methods);
	proto->class_methods = upgrade_protocol_method_list_gcc(p->class_methods);
	assert(proto->isa);
	return proto;
}